

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cc
# Opt level: O1

void __thiscall LexerError::Run(LexerError *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  string err;
  EvalString eval;
  Lexer lexer;
  string local_88;
  EvalString local_68;
  Lexer local_50;
  
  Lexer::Lexer(&local_50,"foo$\nbad $");
  pTVar1 = g_current_test;
  local_68.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  bVar2 = Lexer::ReadEvalString(&local_50,&local_68,false,&local_88);
  bVar2 = testing::Test::Check
                    (pTVar1,!bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/lexer_test.cc"
                     ,0x4b,"lexer.ReadVarValue(&eval, &err)");
  pTVar1 = g_current_test;
  if (bVar2) {
    iVar3 = std::__cxx11::string::compare((char *)&local_88);
    testing::Test::Check
              (pTVar1,iVar3 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/lexer_test.cc"
               ,0x4f,
               "\"input:2: bad $-escape (literal $ must be written as $$)\\n\" \"bad $\\n\" \"    ^ near here\" == err"
              );
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector(&local_68.parsed_);
  return;
}

Assistant:

TEST(Lexer, Error) {
  Lexer lexer("foo$\nbad $");
  EvalString eval;
  string err;
  ASSERT_FALSE(lexer.ReadVarValue(&eval, &err));
  EXPECT_EQ("input:2: bad $-escape (literal $ must be written as $$)\n"
            "bad $\n"
            "    ^ near here"
            , err);
}